

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryVk.cpp
# Opt level: O0

GraphicsAdapterInfo *
Diligent::anon_unknown_0::GetPhysicalDeviceGraphicsAdapterInfo
          (GraphicsAdapterInfo *__return_storage_ptr__,VulkanPhysicalDevice *PhysicalDevice)

{
  byte bVar1;
  VkBool32 Feature;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  VkPhysicalDeviceHostImageCopyPropertiesEXT *pVVar5;
  PFN_vkGetPhysicalDeviceFormatProperties p_Var6;
  PFN_vkGetPhysicalDeviceFragmentShadingRatesKHR p_Var7;
  VkPhysicalDeviceFeatures *pVVar8;
  ExtensionProperties *pEVar9;
  ADAPTER_TYPE AVar10;
  ADAPTER_VENDOR AVar11;
  SHADING_RATE_COMBINER SVar12;
  uchar uVar13;
  SAMPLE_COUNT SVar14;
  SHADING_RATE SVar15;
  COMMAND_QUEUE_TYPE CVar16;
  SHADING_RATE_CAP_FLAGS SVar17;
  DRAW_COMMAND_CAP_FLAGS DVar18;
  SHADER_TYPE SVar19;
  WAVE_FEATURE WVar20;
  BIND_FLAGS BVar21;
  SPARSE_RESOURCE_CAP_FLAGS SVar22;
  ShadingRateProperties *pSVar23;
  VkPhysicalDevice pVVar24;
  Char *pCVar25;
  VkPhysicalDeviceFragmentShadingRateKHR *pVVar26;
  unsigned_long *Src_00;
  reference pvVar27;
  AdapterMemoryInfo *pAVar28;
  size_type sVar29;
  uint *puVar30;
  const_reference pvVar31;
  CommandQueueInfo *pCVar32;
  uint uVar33;
  char (*Args_1) [22];
  ComputeShaderProperties *Args_1_00;
  ulong uVar34;
  char (*Args_1_01) [100];
  bool bVar35;
  SHADING_RATE_COMBINER local_31b;
  Bool local_31a;
  CommandQueueInfo *DstQueue;
  VkQueueFamilyProperties *SrcQueue;
  Uint32 q;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *QueueProperties;
  reference local_2d8;
  reference local_2c8;
  VkMemoryHeap *local_2b8;
  VkMemoryHeap *HeapInfo;
  undefined1 local_2a8 [4];
  uint32_t heap;
  reference local_298;
  reference local_288;
  undefined4 local_274;
  VkMemoryType *pVStack_270;
  VkMemoryPropertyFlags UnifiedMemoryFlags;
  VkMemoryType *MemTypeInfo;
  VkPhysicalDeviceMemoryProperties *pVStack_260;
  uint32_t type;
  VkPhysicalDeviceMemoryProperties *MemoryProps;
  bitset<16UL> UnifiedHeap;
  bitset<16UL> HostVisibleHeap;
  bitset<16UL> DeviceLocalHeap;
  AdapterMemoryInfo *Mem;
  anon_class_8_1_6e94c8e0 SetSparseResCap;
  SparseResourceProperties *SparseRes;
  VkPhysicalDeviceSparseProperties *SparseProps;
  string msg_3;
  DrawCommandProperties *DrawCommandProps;
  string msg_2;
  uint local_1d0;
  VkFormatProperties vkFmtProps;
  anon_class_24_3_af8bfc46 TestImageUsage;
  VkImageUsageFlags vkSRTexUsage;
  VkFormat vkSRTexFormat;
  string msg_1;
  ShadingRateMode *Dst;
  VkPhysicalDeviceFragmentShadingRateKHR *Src;
  unsigned_long uStack_170;
  Uint32 i_1;
  size_type local_168;
  undefined4 local_15c;
  reference pVStack_158;
  VkSampleCountFlags VK_SAMPLE_COUNT_ALL;
  VkPhysicalDeviceFragmentShadingRateKHR *SR;
  iterator __end4;
  iterator __begin4;
  vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
  *__range4;
  string msg;
  uint32_t local_104;
  undefined1 local_100 [4];
  Uint32 ShadingRateCount;
  vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
  ShadingRates;
  anon_class_8_1_78373e84 SetShadingRateCap;
  ShadingRateProperties *ShadingRateProps;
  ComputeShaderProperties *CompProps;
  MeshShaderProperties *MeshProps;
  WaveOpProperties *WaveOpProps;
  uint local_b8;
  VkShaderStageFlags VK_SHADER_STAGE_ALL_RAY_TRACING;
  VkShaderStageFlags SupportedStages;
  VkShaderStageFlags WaveOpStages;
  VkPhysicalDeviceSubgroupProperties *vkWaveProps;
  RayTracingProperties *RayTracingProps;
  VkPhysicalDeviceAccelerationStructurePropertiesKHR *vkASLimits;
  VkPhysicalDeviceRayTracingPipelinePropertiesKHR *vkRTPipelineProps;
  SamplerProperties *SamProps;
  TextureProperties *TexProps;
  BufferProperties *BufferProps;
  ulong local_48;
  size_t i;
  VkPhysicalDeviceLimits *vkDeviceLimits;
  ExtensionFeatures *vkExtFeatures;
  VkPhysicalDeviceFeatures *vkFeatures;
  ExtensionProperties *vkDeviceExtProps;
  VkPhysicalDeviceProperties *vkDeviceProps;
  VulkanPhysicalDevice *pVStack_10;
  uint32_t vkVersion;
  VulkanPhysicalDevice *PhysicalDevice_local;
  
  pVStack_10 = PhysicalDevice;
  GraphicsAdapterInfo::GraphicsAdapterInfo(__return_storage_ptr__);
  vkDeviceProps._4_4_ = VulkanUtilities::VulkanPhysicalDevice::GetVkVersion(pVStack_10);
  vkDeviceExtProps =
       (ExtensionProperties *)VulkanUtilities::VulkanPhysicalDevice::GetProperties(pVStack_10);
  vkFeatures = (VkPhysicalDeviceFeatures *)
               VulkanUtilities::VulkanPhysicalDevice::GetExtProperties(pVStack_10);
  vkExtFeatures =
       (ExtensionFeatures *)VulkanUtilities::VulkanPhysicalDevice::GetFeatures(pVStack_10);
  vkDeviceLimits =
       (VkPhysicalDeviceLimits *)VulkanUtilities::VulkanPhysicalDevice::GetExtFeatures(pVStack_10);
  i = (size_t)&(vkDeviceExtProps->DescriptorIndexing).
               shaderSampledImageArrayNonUniformIndexingNative;
  local_48 = 0;
  while( true ) {
    bVar35 = false;
    if (local_48 < 0x7f) {
      bVar35 = *(char *)((long)(vkDeviceExtProps->MeshShader).maxTaskWorkGroupCount + local_48) !=
               '\0';
    }
    if (!bVar35) break;
    __return_storage_ptr__->Description[local_48] =
         *(Char *)((long)(vkDeviceExtProps->MeshShader).maxTaskWorkGroupCount + local_48);
    local_48 = local_48 + 1;
  }
  AVar10 = VkPhysicalDeviceTypeToAdapterType
                     ((vkDeviceExtProps->MeshShader).maxTaskWorkGroupTotalCount);
  __return_storage_ptr__->Type = AVar10;
  AVar11 = VendorIdToAdapterVendor(*(Uint32 *)&(vkDeviceExtProps->MeshShader).pNext);
  __return_storage_ptr__->Vendor = AVar11;
  __return_storage_ptr__->VendorId = *(Uint32 *)&(vkDeviceExtProps->MeshShader).pNext;
  __return_storage_ptr__->DeviceId = *(Uint32 *)((long)&(vkDeviceExtProps->MeshShader).pNext + 4);
  __return_storage_ptr__->NumOutputs = 0;
  VkFeaturesToDeviceFeatures
            ((DeviceFeatures *)((long)&BufferProps + 1),vkDeviceProps._4_4_,
             (VkPhysicalDeviceFeatures *)vkExtFeatures,
             (VkPhysicalDeviceProperties *)vkDeviceExtProps,(ExtensionFeatures *)vkDeviceLimits,
             (ExtensionProperties *)vkFeatures,DEVICE_FEATURE_STATE_OPTIONAL);
  memcpy(&__return_storage_ptr__->Features,(void *)((long)&BufferProps + 1),0x2f);
  (__return_storage_ptr__->Buffer).ConstantBufferOffsetAlignment =
       (Uint32)*(undefined8 *)(i + 0x140);
  (__return_storage_ptr__->Buffer).StructuredBufferOffsetAlignment =
       (Uint32)*(undefined8 *)(i + 0x148);
  (__return_storage_ptr__->Texture).MaxTexture1DDimension = *(Uint32 *)i;
  (__return_storage_ptr__->Texture).MaxTexture1DArraySlices = *(Uint32 *)(i + 0x10);
  (__return_storage_ptr__->Texture).MaxTexture2DDimension = *(Uint32 *)(i + 4);
  (__return_storage_ptr__->Texture).MaxTexture2DArraySlices = *(Uint32 *)(i + 0x10);
  (__return_storage_ptr__->Texture).MaxTexture3DDimension = *(Uint32 *)(i + 8);
  (__return_storage_ptr__->Texture).MaxTextureCubeDimension = *(Uint32 *)(i + 0xc);
  (__return_storage_ptr__->Texture).Texture2DMSSupported = true;
  (__return_storage_ptr__->Texture).Texture2DMSArraySupported = true;
  (__return_storage_ptr__->Texture).TextureViewSupported = true;
  (__return_storage_ptr__->Texture).CubemapArraysSupported =
       *(int *)&(vkExtFeatures->MeshShader).pNext != 0;
  if ((*(byte *)((long)vkDeviceLimits[1].maxComputeWorkGroupCount + 7) & 1) == 0) {
    local_31a = true;
  }
  else {
    local_31a = vkDeviceLimits->maxColorAttachments == 1;
  }
  (__return_storage_ptr__->Texture).TextureView2DOn3DSupported = local_31a;
  (__return_storage_ptr__->Sampler).BorderSamplingModeSupported = true;
  (__return_storage_ptr__->Sampler).MaxAnisotropy = (Uint8)(int)*(float *)(i + 0x110);
  (__return_storage_ptr__->Sampler).LODBiasSupported = true;
  if ((__return_storage_ptr__->Features).RayTracing != DEVICE_FEATURE_STATE_DISABLED) {
    (__return_storage_ptr__->RayTracing).MaxRecursionDepth = vkFeatures[1].sampleRateShading;
    (__return_storage_ptr__->RayTracing).ShaderGroupHandleSize = vkFeatures[1].tessellationShader;
    (__return_storage_ptr__->RayTracing).MaxShaderRecordStride = vkFeatures[1].dualSrcBlend;
    (__return_storage_ptr__->RayTracing).ShaderGroupBaseAlignment = vkFeatures[1].logicOp;
    (__return_storage_ptr__->RayTracing).MaxRayGenThreads = vkFeatures[1].drawIndirectFirstInstance;
    uVar2 = vkFeatures->sparseResidencyImage2D;
    (__return_storage_ptr__->RayTracing).MaxInstancesPerTLAS = uVar2;
    uVar3 = vkFeatures->sparseResidency2Samples;
    (__return_storage_ptr__->RayTracing).MaxPrimitivesPerBLAS = uVar3;
    uVar4 = vkFeatures->sparseBinding;
    (__return_storage_ptr__->RayTracing).MaxGeometriesPerBLAS = uVar4;
    (__return_storage_ptr__->RayTracing).VertexBufferAlignment = 1;
    (__return_storage_ptr__->RayTracing).IndexBufferAlignment = 1;
    (__return_storage_ptr__->RayTracing).TransformBufferAlignment = 0x10;
    (__return_storage_ptr__->RayTracing).BoxBufferAlignment = 8;
    (__return_storage_ptr__->RayTracing).ScratchBufferAlignment = vkFeatures->inheritedQueries;
    (__return_storage_ptr__->RayTracing).InstanceBufferAlignment = 0x10;
    if (vkDeviceLimits->maxGeometryInputComponents != 0) {
      Diligent::operator|=
                (&(__return_storage_ptr__->RayTracing).CapFlags,
                 RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS);
    }
    if (vkDeviceLimits->maxComputeWorkGroupCount[1] != 0) {
      Diligent::operator|=
                (&(__return_storage_ptr__->RayTracing).CapFlags,
                 RAY_TRACING_CAP_FLAG_INLINE_RAY_TRACING);
    }
    if (vkDeviceLimits->maxGeometryTotalOutputComponents != 0) {
      Diligent::operator|=
                (&(__return_storage_ptr__->RayTracing).CapFlags,
                 RAY_TRACING_CAP_FLAG_INDIRECT_RAY_TRACING);
    }
  }
  pVVar8 = vkFeatures;
  if ((__return_storage_ptr__->Features).WaveOp != DEVICE_FEATURE_STATE_DISABLED) {
    uVar33 = vkFeatures[1].sparseResidencyAliased;
    local_b8 = uVar33 & 0x31;
    if ((vkExtFeatures->MeshShader).taskShader != 0) {
      local_b8 = uVar33 & 0x39;
    }
    if ((vkExtFeatures->MeshShader).meshShader != 0) {
      local_b8 = uVar33 & 6 | local_b8;
    }
    if ((vkDeviceLimits->maxTexelBufferElements != 0) && (vkDeviceLimits->maxImageArrayLayers != 0))
    {
      local_b8 = uVar33 & 0xc0 | local_b8;
    }
    if (vkDeviceLimits->maxGeometryInputComponents != 0) {
      local_b8 = uVar33 & 0x3f00 | local_b8;
    }
    (__return_storage_ptr__->WaveOp).MinSize = vkFeatures[1].sparseResidency16Samples;
    (__return_storage_ptr__->WaveOp).MaxSize = vkFeatures[1].sparseResidency16Samples;
    SVar19 = VkShaderStageFlagsToShaderTypes(local_b8);
    (__return_storage_ptr__->WaveOp).SupportedStages = SVar19;
    WVar20 = VkSubgroupFeatureFlagsToWaveFeatures(pVVar8[1].variableMultisampleRate);
    (__return_storage_ptr__->WaveOp).Features = WVar20;
  }
  if ((__return_storage_ptr__->Features).MeshShaders != DEVICE_FEATURE_STATE_DISABLED) {
    (__return_storage_ptr__->MeshShader).MaxThreadGroupCountX = vkFeatures->largePoints;
    (__return_storage_ptr__->MeshShader).MaxThreadGroupCountY = vkFeatures->alphaToOne;
    (__return_storage_ptr__->MeshShader).MaxThreadGroupCountZ = vkFeatures->multiViewport;
    (__return_storage_ptr__->MeshShader).MaxThreadGroupTotalCount = vkFeatures->wideLines;
  }
  Args_1_00 = &__return_storage_ptr__->ComputeShader;
  Args_1_00->SharedMemorySize =
       (vkDeviceExtProps->ShadingRate).maxFragmentShadingRateAttachmentTexelSize.width;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupInvocations =
       (vkDeviceExtProps->ShadingRate).layeredShadingRateAttachments;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeX =
       (vkDeviceExtProps->ShadingRate).fragmentShadingRateNonTrivialCombinerOps;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeY =
       (vkDeviceExtProps->ShadingRate).maxFragmentSize.width;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeZ =
       (vkDeviceExtProps->ShadingRate).maxFragmentSize.height;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupCountX =
       (vkDeviceExtProps->ShadingRate).maxFragmentShadingRateAttachmentTexelSize.height;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupCountY =
       (vkDeviceExtProps->ShadingRate).maxFragmentShadingRateAttachmentTexelSizeAspectRatio;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupCountZ =
       (vkDeviceExtProps->ShadingRate).primitiveFragmentShadingRateWithMultipleViewports;
  if ((__return_storage_ptr__->Features).VariableRateShading != DEVICE_FEATURE_STATE_DISABLED) {
    pSVar23 = &__return_storage_ptr__->ShadingRate;
    if (((vkDeviceLimits[1].maxUniformBufferRange == 0) &&
        (vkDeviceLimits[1].maxStorageBufferRange == 0)) &&
       (vkDeviceLimits[1].maxPushConstantsSize == 0)) {
      if ((int)vkDeviceLimits[1].sparseAddressSpaceSize != 0) {
        (__return_storage_ptr__->ShadingRate).Format = SHADING_RATE_FORMAT_UNORM8;
        SVar12 = Diligent::operator|(SHADING_RATE_COMBINER_PASSTHROUGH,
                                     SHADING_RATE_COMBINER_OVERRIDE);
        (__return_storage_ptr__->ShadingRate).Combiners = SVar12;
        SVar17 = Diligent::operator|(SHADING_RATE_CAP_FLAG_TEXTURE_BASED,
                                     SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS);
        SVar17 = Diligent::operator|(SVar17,SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET);
        (__return_storage_ptr__->ShadingRate).CapFlags = SVar17;
        if (*(int *)((long)&vkDeviceLimits[1].sparseAddressSpaceSize + 4) == 0) {
          if (vkDeviceLimits[1].maxPerStageDescriptorInputAttachments == 0) {
            (__return_storage_ptr__->ShadingRate).ShadingRateTextureAccess =
                 SHADING_RATE_TEXTURE_ACCESS_ON_SET_RTV;
          }
          else {
            (__return_storage_ptr__->ShadingRate).ShadingRateTextureAccess =
                 SHADING_RATE_TEXTURE_ACCESS_ON_SUBMIT;
          }
        }
        else {
          (__return_storage_ptr__->ShadingRate).ShadingRateTextureAccess =
               SHADING_RATE_TEXTURE_ACCESS_ON_GPU;
        }
        if (vkFeatures[2].sparseBinding != 0) {
          Diligent::operator|=
                    (&(__return_storage_ptr__->ShadingRate).CapFlags,
                     SHADING_RATE_CAP_FLAG_ADDITIONAL_INVOCATIONS);
        }
        if (vkDeviceLimits[1].maxBoundDescriptorSets != 0) {
          Diligent::operator|=
                    (&(__return_storage_ptr__->ShadingRate).CapFlags,
                     SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET);
        }
        (__return_storage_ptr__->ShadingRate).MaxSabsampledArraySlices = vkFeatures[3].depthClamp;
        (__return_storage_ptr__->ShadingRate).MinTileSize[0] = vkFeatures[2].shaderInt64;
        (__return_storage_ptr__->ShadingRate).MinTileSize[1] = vkFeatures[2].shaderInt16;
        (__return_storage_ptr__->ShadingRate).MaxTileSize[0] = vkFeatures[2].shaderResourceResidency
        ;
        Args_1_00 = (ComputeShaderProperties *)(ulong)vkFeatures[2].shaderResourceMinLod;
        (__return_storage_ptr__->ShadingRate).MaxTileSize[1] = vkFeatures[2].shaderResourceMinLod;
        (__return_storage_ptr__->ShadingRate).NumShadingRates = '\x01';
        pSVar23->ShadingRates[0].Rate = SHADING_RATE_1X1;
        (__return_storage_ptr__->ShadingRate).ShadingRates[0].SampleBits = SAMPLE_COUNT_ALL;
      }
    }
    else {
      ShadingRates.
      super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pSVar23;
      GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_78373e84::operator()
                ((anon_class_8_1_78373e84 *)
                 &ShadingRates.
                  super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 vkDeviceLimits[1].maxUniformBufferRange,SHADING_RATE_CAP_FLAG_PER_DRAW);
      GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_78373e84::operator()
                ((anon_class_8_1_78373e84 *)
                 &ShadingRates.
                  super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 vkDeviceLimits[1].maxStorageBufferRange,SHADING_RATE_CAP_FLAG_PER_PRIMITIVE);
      GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_78373e84::operator()
                ((anon_class_8_1_78373e84 *)
                 &ShadingRates.
                  super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 vkDeviceLimits[1].maxPushConstantsSize,SHADING_RATE_CAP_FLAG_TEXTURE_BASED);
      GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_78373e84::operator()
                ((anon_class_8_1_78373e84 *)
                 &ShadingRates.
                  super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 vkFeatures[2].shaderStorageImageMultisample,SHADING_RATE_CAP_FLAG_SAMPLE_MASK);
      GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_78373e84::operator()
                ((anon_class_8_1_78373e84 *)
                 &ShadingRates.
                  super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 vkFeatures[2].shaderStorageImageReadWithoutFormat,
                 SHADING_RATE_CAP_FLAG_SHADER_SAMPLE_MASK);
      GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_78373e84::operator()
                ((anon_class_8_1_78373e84 *)
                 &ShadingRates.
                  super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 vkFeatures[2].shaderStorageImageExtendedFormats,
                 SHADING_RATE_CAP_FLAG_SHADER_DEPTH_STENCIL_WRITE);
      GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_78373e84::operator()
                ((anon_class_8_1_78373e84 *)
                 &ShadingRates.
                  super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 vkFeatures[2].textureCompressionASTC_LDR,
                 SHADING_RATE_CAP_FLAG_PER_PRIMITIVE_WITH_MULTIPLE_VIEWPORTS);
      GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_78373e84::operator()
                ((anon_class_8_1_78373e84 *)
                 &ShadingRates.
                  super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 vkFeatures[2].textureCompressionBC,SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY);
      SVar17 = Diligent::operator&((__return_storage_ptr__->ShadingRate).CapFlags,
                                   SHADING_RATE_CAP_FLAG_TEXTURE_BASED);
      if (SVar17 != SHADING_RATE_CAP_FLAG_NONE) {
        Diligent::operator|=
                  (&(__return_storage_ptr__->ShadingRate).CapFlags,
                   SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET);
      }
      Diligent::operator|=
                (&(__return_storage_ptr__->ShadingRate).CapFlags,
                 SHADING_RATE_CAP_FLAG_SHADING_RATE_SHADER_INPUT);
      SVar12 = Diligent::operator|(SHADING_RATE_COMBINER_PASSTHROUGH,SHADING_RATE_COMBINER_OVERRIDE)
      ;
      (__return_storage_ptr__->ShadingRate).Combiners = SVar12;
      if (vkFeatures[2].occlusionQueryPrecise != 0) {
        SVar12 = Diligent::operator|(SHADING_RATE_COMBINER_MIN,SHADING_RATE_COMBINER_MAX);
        Diligent::operator|=(&(__return_storage_ptr__->ShadingRate).Combiners,SVar12);
        local_31b = SHADING_RATE_COMBINER_LAST;
        if (vkFeatures[2].shaderStorageBufferArrayDynamicIndexing == 0) {
          local_31b = SHADING_RATE_COMBINER_SUM;
        }
        Diligent::operator|=(&(__return_storage_ptr__->ShadingRate).Combiners,local_31b);
      }
      if (vkDeviceLimits[1].maxPushConstantsSize != 0) {
        (__return_storage_ptr__->ShadingRate).Format = SHADING_RATE_FORMAT_PALETTE;
        (__return_storage_ptr__->ShadingRate).MinTileSize[0] = vkFeatures[2].largePoints;
        (__return_storage_ptr__->ShadingRate).MinTileSize[1] = vkFeatures[2].alphaToOne;
        (__return_storage_ptr__->ShadingRate).MaxTileSize[0] = vkFeatures[2].multiViewport;
        (__return_storage_ptr__->ShadingRate).MaxTileSize[1] = vkFeatures[2].samplerAnisotropy;
      }
      std::
      vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ::vector((vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                *)local_100);
      p_Var7 = vkGetPhysicalDeviceFragmentShadingRatesKHR;
      local_104 = 0;
      pVVar24 = VulkanUtilities::VulkanPhysicalDevice::GetVkDeviceHandle(pVStack_10);
      Args_1 = (char (*) [22])0x0;
      (*p_Var7)(pVVar24,&local_104,(VkPhysicalDeviceFragmentShadingRateKHR *)0x0);
      if (local_104 < 3) {
        FormatString<char[26],char[22]>
                  ((string *)&__range4,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"ShadingRateCount >= 3",Args_1);
        pCVar25 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar25,"GetPhysicalDeviceGraphicsAdapterInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
                   ,0x15d);
        std::__cxx11::string::~string((string *)&__range4);
      }
      std::
      vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ::resize((vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                *)local_100,(ulong)local_104);
      __end4 = std::
               vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
               ::begin((vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                        *)local_100);
      SR = (VkPhysicalDeviceFragmentShadingRateKHR *)
           std::
           vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
           ::end((vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  *)local_100);
      while (bVar35 = __gnu_cxx::operator!=
                                (&__end4,(__normal_iterator<VkPhysicalDeviceFragmentShadingRateKHR_*,_std::vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>_>
                                          *)&SR),
            p_Var7 = vkGetPhysicalDeviceFragmentShadingRatesKHR, bVar35) {
        pVStack_158 = __gnu_cxx::
                      __normal_iterator<VkPhysicalDeviceFragmentShadingRateKHR_*,_std::vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>_>
                      ::operator*(&__end4);
        pVStack_158->sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_KHR;
        __gnu_cxx::
        __normal_iterator<VkPhysicalDeviceFragmentShadingRateKHR_*,_std::vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>_>
        ::operator++(&__end4);
      }
      pVVar24 = VulkanUtilities::VulkanPhysicalDevice::GetVkDeviceHandle(pVStack_10);
      pVVar26 = std::
                vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                ::data((vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                        *)local_100);
      (*p_Var7)(pVVar24,&local_104,pVVar26);
      local_15c = 0x7f;
      local_168 = std::
                  vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ::size((vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                          *)local_100);
      uStack_170 = 9;
      Src_00 = std::min<unsigned_long>(&local_168,&stack0xfffffffffffffe90);
      uVar13 = StaticCast<unsigned_char,unsigned_long>(Src_00);
      (__return_storage_ptr__->ShadingRate).NumShadingRates = uVar13;
      for (Src._4_4_ = 0; bVar1 = (__return_storage_ptr__->ShadingRate).NumShadingRates,
          Args_1_00 = (ComputeShaderProperties *)(ulong)bVar1, Src._4_4_ < bVar1;
          Src._4_4_ = Src._4_4_ + 1) {
        pvVar27 = std::
                  vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                  ::operator[]((vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                                *)local_100,(ulong)Src._4_4_);
        msg_1.field_2._8_8_ = pSVar23->ShadingRates + Src._4_4_;
        if ((((pvVar27->fragmentSize).width != 1) || ((pvVar27->fragmentSize).height != 1)) &&
           (uVar33 = vkFeatures[2].shaderImageGatherExtended * 2 - 1, uVar33 < pvVar27->sampleCounts
           )) {
          FormatString<char[26],char[201]>
                    ((string *)&vkSRTexUsage,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])
                     "(Src.fragmentSize.width == 1 && Src.fragmentSize.height == 1) || (Uint32{Src.sampleCounts} <= ((static_cast<Uint32>(vkDeviceExtProps.ShadingRate.maxFragmentShadingRateRasterizationSamples) << 1) - 1))"
                     ,(char (*) [201])(ulong)uVar33);
          pCVar25 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar25,"GetPhysicalDeviceGraphicsAdapterInfo",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
                     ,0x172);
          std::__cxx11::string::~string((string *)&vkSRTexUsage);
        }
        SVar14 = VkSampleCountFlagsToSampleCount(pvVar27->sampleCounts & 0x7f);
        *(SAMPLE_COUNT *)(msg_1.field_2._8_8_ + 1) = SVar14;
        SVar15 = VkFragmentSizeToShadingRate(&pvVar27->fragmentSize);
        *(SHADING_RATE *)msg_1.field_2._8_8_ = SVar15;
      }
      std::
      vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ::~vector((vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                 *)local_100);
    }
    SVar17 = Diligent::operator&((__return_storage_ptr__->ShadingRate).CapFlags,
                                 SHADING_RATE_CAP_FLAG_TEXTURE_BASED);
    if (SVar17 != SHADING_RATE_CAP_FLAG_NONE) {
      if ((__return_storage_ptr__->ShadingRate).Format == SHADING_RATE_FORMAT_UNORM8) {
        TestImageUsage.vkSRTexUsage._4_4_ = VK_FORMAT_R8G8_UNORM;
        TestImageUsage.vkSRTexUsage._0_4_ = 0x200;
      }
      else {
        TestImageUsage.vkSRTexUsage._4_4_ = VK_FORMAT_R8_UINT;
        TestImageUsage.vkSRTexUsage._0_4_ = 0x100;
      }
      vkFmtProps._4_8_ = pVStack_10;
      TestImageUsage.PhysicalDevice =
           (VulkanPhysicalDevice *)((long)&TestImageUsage.vkSRTexUsage + 4);
      TestImageUsage.vkSRTexFormat = (VkFormat *)&TestImageUsage.vkSRTexUsage;
      memset((void *)((long)&msg_2.field_2 + 0xc),0,0xc);
      p_Var6 = vkGetPhysicalDeviceFormatProperties;
      pVVar24 = VulkanUtilities::VulkanPhysicalDevice::GetVkDeviceHandle(pVStack_10);
      (*p_Var6)(pVVar24,TestImageUsage.vkSRTexUsage._4_4_,
                (VkFormatProperties *)((long)&msg_2.field_2 + 0xc));
      if ((local_1d0 & 0x41000000) == 0) {
        FormatString<char[26],char[145]>
                  ((string *)&DrawCommandProps,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "vkFmtProps.optimalTilingFeatures & (VK_FORMAT_FEATURE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR | VK_FORMAT_FEATURE_FRAGMENT_DENSITY_MAP_BIT_EXT)"
                   ,(char (*) [145])Args_1_00);
        pCVar25 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar25,"GetPhysicalDeviceGraphicsAdapterInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
                   ,0x1b5);
        std::__cxx11::string::~string((string *)&DrawCommandProps);
      }
      (__return_storage_ptr__->ShadingRate).BindFlags = BIND_FLAG_LAST;
      if (((local_1d0 & 1) != 0) &&
         (bVar35 = GetPhysicalDeviceGraphicsAdapterInfo::anon_class_24_3_af8bfc46::operator()
                             ((anon_class_24_3_af8bfc46 *)&vkFmtProps.optimalTilingFeatures,4),
         bVar35)) {
        Diligent::operator|=(&(__return_storage_ptr__->ShadingRate).BindFlags,BIND_SHADER_RESOURCE);
      }
      if (((local_1d0 & 2) != 0) &&
         (bVar35 = GetPhysicalDeviceGraphicsAdapterInfo::anon_class_24_3_af8bfc46::operator()
                             ((anon_class_24_3_af8bfc46 *)&vkFmtProps.optimalTilingFeatures,8),
         bVar35)) {
        Diligent::operator|=(&(__return_storage_ptr__->ShadingRate).BindFlags,BIND_UNORDERED_ACCESS)
        ;
      }
      if (((local_1d0 & 0x80) != 0) &&
         (bVar35 = GetPhysicalDeviceGraphicsAdapterInfo::anon_class_24_3_af8bfc46::operator()
                             ((anon_class_24_3_af8bfc46 *)&vkFmtProps.optimalTilingFeatures,0x10),
         bVar35)) {
        Diligent::operator|=(&(__return_storage_ptr__->ShadingRate).BindFlags,BIND_RENDER_TARGET);
      }
    }
  }
  msg_3.field_2._8_8_ = &__return_storage_ptr__->DrawCommand;
  (__return_storage_ptr__->DrawCommand).MaxIndexValue =
       (vkDeviceExtProps->ShadingRate).fragmentShadingRateWithShaderDepthStencilWrites;
  uVar33 = (vkDeviceExtProps->ShadingRate).fragmentShadingRateWithSampleMask;
  uVar34 = (ulong)uVar33;
  (__return_storage_ptr__->DrawCommand).MaxDrawIndirectCount = uVar33;
  DVar18 = Diligent::operator|(DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT,DRAW_COMMAND_CAP_FLAG_BASE_VERTEX
                              );
  Args_1_01 = (char (*) [100])CONCAT62((int6)(uVar34 >> 0x10),DVar18);
  *(DRAW_COMMAND_CAP_FLAGS *)msg_3.field_2._8_8_ = DVar18;
  if ((*(int *)&(vkExtFeatures->MeshShader).field_0x24 != 0) ||
     ((*(byte *)((long)vkDeviceLimits[1].maxComputeWorkGroupCount + 9) & 1) != 0)) {
    Diligent::operator|=
              ((DRAW_COMMAND_CAP_FLAGS *)msg_3.field_2._8_8_,
               DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT);
  }
  if ((vkExtFeatures->Storage16Bit).sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
    Diligent::operator|=
              ((DRAW_COMMAND_CAP_FLAGS *)msg_3.field_2._8_8_,
               DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_FIRST_INSTANCE);
  }
  if ((*(byte *)((long)vkDeviceLimits[1].maxComputeWorkGroupCount + 9) & 1) != 0) {
    Diligent::operator|=
              ((DRAW_COMMAND_CAP_FLAGS *)msg_3.field_2._8_8_,
               DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER);
  }
  if ((__return_storage_ptr__->Features).SparseResources != DEVICE_FEATURE_STATE_DISABLED) {
    if ((*(int *)&(vkExtFeatures->RayTracingPipeline).pNext == 0) ||
       ((*(int *)((long)&(vkExtFeatures->RayTracingPipeline).pNext + 4) == 0 &&
        ((vkExtFeatures->RayTracingPipeline).rayTracingPipeline == 0)))) {
      FormatString<char[26],char[100]>
                ((string *)&SparseProps,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "vkFeatures.sparseBinding && (vkFeatures.sparseResidencyBuffer || vkFeatures.sparseResidencyImage2D)"
                 ,Args_1_01);
      pCVar25 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar25,"GetPhysicalDeviceGraphicsAdapterInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
                 ,0x1d6);
      std::__cxx11::string::~string((string *)&SparseProps);
    }
    pEVar9 = vkDeviceExtProps;
    pVVar5 = &vkDeviceExtProps->HostImageCopy;
    SetSparseResCap.SparseRes = &__return_storage_ptr__->SparseResources;
    (SetSparseResCap.SparseRes)->AddressSpaceSize = *(Uint64 *)(i + 0x38);
    (__return_storage_ptr__->SparseResources).ResourceSpaceSize = *(Uint64 *)(i + 0x38);
    (__return_storage_ptr__->SparseResources).StandardBlockSize = 0x10000;
    BVar21 = Diligent::operator|(BIND_VERTEX_BUFFER,BIND_INDEX_BUFFER);
    BVar21 = Diligent::operator|(BVar21,BIND_UNIFORM_BUFFER);
    BVar21 = Diligent::operator|(BVar21,BIND_SHADER_RESOURCE);
    BVar21 = Diligent::operator|(BVar21,BIND_UNORDERED_ACCESS);
    BVar21 = Diligent::operator|(BVar21,BIND_INDIRECT_DRAW_ARGS);
    BVar21 = Diligent::operator|(BVar21,BIND_RAY_TRACING);
    (SetSparseResCap.SparseRes)->BufferBindFlags = BVar21;
    SVar22 = Diligent::operator|(SPARSE_RESOURCE_CAP_FLAG_NON_RESIDENT_SAFE,
                                 SPARSE_RESOURCE_CAP_FLAG_MIXED_RESOURCE_TYPE_SUPPORT);
    Diligent::operator|=(&(SetSparseResCap.SparseRes)->CapFlags,SVar22);
    Mem = (AdapterMemoryInfo *)SetSparseResCap.SparseRes;
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,pVVar5->identicalMemoryTypeRequirements,
               SPARSE_RESOURCE_CAP_FLAG_STANDARD_2D_TILE_SHAPE);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,*(VkBool32 *)&(pEVar9->HostImageCopy).field_0x44,
               SPARSE_RESOURCE_CAP_FLAG_STANDARD_2DMS_TILE_SHAPE);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,
               *(VkBool32 *)
                &(pEVar9->HostImageCopyLayouts)._M_t.
                 super___uniq_ptr_impl<VkImageLayout,_std::default_delete<VkImageLayout[]>_>._M_t.
                 super__Tuple_impl<0UL,_VkImageLayout_*,_std::default_delete<VkImageLayout[]>_>.
                 super__Head_base<0UL,_VkImageLayout_*,_false>._M_head_impl,
               SPARSE_RESOURCE_CAP_FLAG_STANDARD_3D_TILE_SHAPE);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,
               *(VkBool32 *)
                ((long)&(pEVar9->HostImageCopyLayouts)._M_t.
                        super___uniq_ptr_impl<VkImageLayout,_std::default_delete<VkImageLayout[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_VkImageLayout_*,_std::default_delete<VkImageLayout[]>_>
                        .super__Head_base<0UL,_VkImageLayout_*,_false>._M_head_impl + 4),
               SPARSE_RESOURCE_CAP_FLAG_ALIGNED_MIP_SIZE);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,pEVar9[1].MeshShader.sType,
               SPARSE_RESOURCE_CAP_FLAG_NON_RESIDENT_STRICT);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,(vkExtFeatures->RayTracingPipeline).sType,
               SPARSE_RESOURCE_CAP_FLAG_SHADER_RESOURCE_RESIDENCY);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,
               *(VkBool32 *)((long)&(vkExtFeatures->RayTracingPipeline).pNext + 4),
               SPARSE_RESOURCE_CAP_FLAG_BUFFER);
    Feature = (vkExtFeatures->RayTracingPipeline).rayTracingPipeline;
    SVar22 = Diligent::operator|(SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D,
                                 SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,Feature,SVar22);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,
               (vkExtFeatures->RayTracingPipeline).rayTracingPipelineShaderGroupHandleCaptureReplay,
               SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,
               (vkExtFeatures->RayTracingPipeline).
               rayTracingPipelineShaderGroupHandleCaptureReplayMixed,
               SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,
               (vkExtFeatures->RayTracingPipeline).rayTracingPipelineTraceRaysIndirect,
               SPARSE_RESOURCE_CAP_FLAG_TEXTURE_4_SAMPLES);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,
               (vkExtFeatures->RayTracingPipeline).rayTraversalPrimitiveCulling,
               SPARSE_RESOURCE_CAP_FLAG_TEXTURE_8_SAMPLES);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,
               *(VkBool32 *)&(vkExtFeatures->RayTracingPipeline).field_0x24,
               SPARSE_RESOURCE_CAP_FLAG_TEXTURE_16_SAMPLES);
    GetPhysicalDeviceGraphicsAdapterInfo::anon_class_8_1_6e94c8e0::operator()
              ((anon_class_8_1_6e94c8e0 *)&Mem,(vkExtFeatures->RayQuery).sType,
               SPARSE_RESOURCE_CAP_FLAG_ALIASED);
  }
  pAVar28 = &__return_storage_ptr__->Memory;
  pAVar28->LocalMemory = 0;
  (__return_storage_ptr__->Memory).HostVisibleMemory = 0;
  (__return_storage_ptr__->Memory).UnifiedMemory = 0;
  (__return_storage_ptr__->Memory).MaxMemoryAllocation = *(Uint64 *)&vkFeatures[3].independentBlend;
  std::bitset<16UL>::bitset(&HostVisibleHeap);
  std::bitset<16UL>::bitset(&UnifiedHeap);
  std::bitset<16UL>::bitset((bitset<16UL> *)&MemoryProps);
  pVStack_260 = VulkanUtilities::VulkanPhysicalDevice::GetMemoryProperties(pVStack_10);
  for (MemTypeInfo._4_4_ = 0; MemTypeInfo._4_4_ < pVStack_260->memoryTypeCount;
      MemTypeInfo._4_4_ = MemTypeInfo._4_4_ + 1) {
    pVStack_270 = pVStack_260->memoryTypes + MemTypeInfo._4_4_;
    local_274 = 3;
    if ((pVStack_270->propertyFlags & 0x10) == 0) {
      if ((pVStack_270->propertyFlags & 3) == 3) {
        std::bitset<16UL>::operator[]((bitset<16UL> *)&local_288,(size_t)&MemoryProps);
        std::bitset<16UL>::reference::operator=(&local_288,true);
        std::bitset<16UL>::reference::~reference(&local_288);
        if ((pVStack_270->propertyFlags & 4) != 0) {
          Diligent::operator|=
                    (&(__return_storage_ptr__->Memory).UnifiedMemoryCPUAccess,CPU_ACCESS_FLAG_LAST);
        }
        if ((pVStack_270->propertyFlags & 8) != 0) {
          Diligent::operator|=
                    (&(__return_storage_ptr__->Memory).UnifiedMemoryCPUAccess,CPU_ACCESS_READ);
        }
      }
      else if ((pVStack_270->propertyFlags & 1) == 0) {
        if ((pVStack_270->propertyFlags & 2) != 0) {
          std::bitset<16UL>::operator[]((bitset<16UL> *)local_2a8,(size_t)&UnifiedHeap);
          std::bitset<16UL>::reference::operator=((reference *)local_2a8,true);
          std::bitset<16UL>::reference::~reference((reference *)local_2a8);
        }
      }
      else {
        std::bitset<16UL>::operator[]((bitset<16UL> *)&local_298,(size_t)&HostVisibleHeap);
        std::bitset<16UL>::reference::operator=(&local_298,true);
        std::bitset<16UL>::reference::~reference(&local_298);
      }
    }
    else {
      BVar21 = Diligent::operator|(BIND_RENDER_TARGET,BIND_DEPTH_STENCIL);
      BVar21 = Diligent::operator|(BVar21,BIND_INPUT_ATTACHMENT);
      (__return_storage_ptr__->Memory).MemorylessTextureBindFlags = BVar21;
    }
  }
  for (HeapInfo._4_4_ = 0; HeapInfo._4_4_ < pVStack_260->memoryHeapCount;
      HeapInfo._4_4_ = HeapInfo._4_4_ + 1) {
    local_2b8 = pVStack_260->memoryHeaps + HeapInfo._4_4_;
    std::bitset<16UL>::operator[]((bitset<16UL> *)&local_2c8,(size_t)&MemoryProps);
    bVar35 = std::bitset::reference::operator_cast_to_bool((reference *)&local_2c8);
    std::bitset<16UL>::reference::~reference(&local_2c8);
    if (bVar35) {
      (__return_storage_ptr__->Memory).UnifiedMemory =
           local_2b8->size + (__return_storage_ptr__->Memory).UnifiedMemory;
    }
    else {
      std::bitset<16UL>::operator[]((bitset<16UL> *)&local_2d8,(size_t)&HostVisibleHeap);
      bVar35 = std::bitset::reference::operator_cast_to_bool((reference *)&local_2d8);
      std::bitset<16UL>::reference::~reference(&local_2d8);
      if (bVar35) {
        pAVar28->LocalMemory = local_2b8->size + pAVar28->LocalMemory;
      }
      else {
        std::bitset<16UL>::operator[]((bitset<16UL> *)&QueueProperties,(size_t)&UnifiedHeap);
        bVar35 = std::bitset::reference::operator_cast_to_bool((reference *)&QueueProperties);
        std::bitset<16UL>::reference::~reference((reference *)&QueueProperties);
        if (bVar35) {
          (__return_storage_ptr__->Memory).HostVisibleMemory =
               local_2b8->size + (__return_storage_ptr__->Memory).HostVisibleMemory;
        }
      }
    }
  }
  _q = VulkanUtilities::VulkanPhysicalDevice::GetQueueProperties(pVStack_10);
  sVar29 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::size(_q);
  SrcQueue._4_4_ = (undefined4)sVar29;
  puVar30 = std::min<unsigned_int>(&MAX_ADAPTER_QUEUES,(uint *)((long)&SrcQueue + 4));
  __return_storage_ptr__->NumQueues = *puVar30;
  for (SrcQueue._0_4_ = 0; (uint)SrcQueue < __return_storage_ptr__->NumQueues;
      SrcQueue._0_4_ = (uint)SrcQueue + 1) {
    pvVar31 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
              operator[](_q,(ulong)(uint)SrcQueue);
    pCVar32 = __return_storage_ptr__->Queues + (uint)SrcQueue;
    CVar16 = VkQueueFlagsToCmdQueueType(pvVar31->queueFlags);
    pCVar32->QueueType = CVar16;
    pCVar32->MaxDeviceContexts = pvVar31->queueCount;
    pCVar32->TextureCopyGranularity[0] = (pvVar31->minImageTransferGranularity).width;
    pCVar32->TextureCopyGranularity[1] = (pvVar31->minImageTransferGranularity).height;
    pCVar32->TextureCopyGranularity[2] = (pvVar31->minImageTransferGranularity).depth;
  }
  return __return_storage_ptr__;
}

Assistant:

GraphicsAdapterInfo GetPhysicalDeviceGraphicsAdapterInfo(const VulkanUtilities::VulkanPhysicalDevice& PhysicalDevice)
{
    GraphicsAdapterInfo AdapterInfo;

    using ExtensionProperties = VulkanUtilities::VulkanPhysicalDevice::ExtensionProperties;
    using ExtensionFeatures   = VulkanUtilities::VulkanPhysicalDevice::ExtensionFeatures;

    const uint32_t                    vkVersion        = PhysicalDevice.GetVkVersion();
    const VkPhysicalDeviceProperties& vkDeviceProps    = PhysicalDevice.GetProperties();
    const ExtensionProperties&        vkDeviceExtProps = PhysicalDevice.GetExtProperties();
    const VkPhysicalDeviceFeatures&   vkFeatures       = PhysicalDevice.GetFeatures();
    const ExtensionFeatures&          vkExtFeatures    = PhysicalDevice.GetExtFeatures();
    const VkPhysicalDeviceLimits&     vkDeviceLimits   = vkDeviceProps.limits;

    // Set graphics adapter properties
    {
        static_assert(_countof(AdapterInfo.Description) <= _countof(vkDeviceProps.deviceName), "");
        for (size_t i = 0; i < _countof(AdapterInfo.Description) - 1 && vkDeviceProps.deviceName[i] != 0; ++i)
            AdapterInfo.Description[i] = vkDeviceProps.deviceName[i];

        AdapterInfo.Type       = VkPhysicalDeviceTypeToAdapterType(vkDeviceProps.deviceType);
        AdapterInfo.Vendor     = VendorIdToAdapterVendor(vkDeviceProps.vendorID);
        AdapterInfo.VendorId   = vkDeviceProps.vendorID;
        AdapterInfo.DeviceId   = vkDeviceProps.deviceID;
        AdapterInfo.NumOutputs = 0;
    }

    // Label all enabled features as optional
    AdapterInfo.Features = VkFeaturesToDeviceFeatures(vkVersion, vkFeatures, vkDeviceProps, vkExtFeatures, vkDeviceExtProps, DEVICE_FEATURE_STATE_OPTIONAL);

    // Buffer properties
    {
        BufferProperties& BufferProps{AdapterInfo.Buffer};
        BufferProps.ConstantBufferOffsetAlignment   = static_cast<Uint32>(vkDeviceLimits.minUniformBufferOffsetAlignment);
        BufferProps.StructuredBufferOffsetAlignment = static_cast<Uint32>(vkDeviceLimits.minStorageBufferOffsetAlignment);
        ASSERT_SIZEOF(BufferProps, 8, "Did you add a new member to BufferProperites? Please initialize it here.");
    }

    // Texture properties
    {
        TextureProperties& TexProps{AdapterInfo.Texture};
        TexProps.MaxTexture1DDimension      = vkDeviceLimits.maxImageDimension1D;
        TexProps.MaxTexture1DArraySlices    = vkDeviceLimits.maxImageArrayLayers;
        TexProps.MaxTexture2DDimension      = vkDeviceLimits.maxImageDimension2D;
        TexProps.MaxTexture2DArraySlices    = vkDeviceLimits.maxImageArrayLayers;
        TexProps.MaxTexture3DDimension      = vkDeviceLimits.maxImageDimension3D;
        TexProps.MaxTextureCubeDimension    = vkDeviceLimits.maxImageDimensionCube;
        TexProps.Texture2DMSSupported       = True;
        TexProps.Texture2DMSArraySupported  = True;
        TexProps.TextureViewSupported       = True;
        TexProps.CubemapArraysSupported     = vkFeatures.imageCubeArray;
        TexProps.TextureView2DOn3DSupported = vkExtFeatures.HasPortabilitySubset ? vkExtFeatures.PortabilitySubset.imageView2DOn3DImage == VK_TRUE : True;
        ASSERT_SIZEOF(TexProps, 32, "Did you add a new member to TextureProperites? Please initialize it here.");
    }

    // Sampler properties
    {
        SamplerProperties& SamProps{AdapterInfo.Sampler};
        SamProps.BorderSamplingModeSupported = True;
        SamProps.MaxAnisotropy               = static_cast<Uint8>(vkDeviceLimits.maxSamplerAnisotropy);
        SamProps.LODBiasSupported            = True;
        ASSERT_SIZEOF(SamProps, 3, "Did you add a new member to SamplerProperites? Please initialize it here.");
    }

    // Ray tracing properties
    if (AdapterInfo.Features.RayTracing)
    {
        const VkPhysicalDeviceRayTracingPipelinePropertiesKHR&    vkRTPipelineProps = vkDeviceExtProps.RayTracingPipeline;
        const VkPhysicalDeviceAccelerationStructurePropertiesKHR& vkASLimits        = vkDeviceExtProps.AccelStruct;

        RayTracingProperties& RayTracingProps{AdapterInfo.RayTracing};
        RayTracingProps.MaxRecursionDepth        = vkRTPipelineProps.maxRayRecursionDepth;
        RayTracingProps.ShaderGroupHandleSize    = vkRTPipelineProps.shaderGroupHandleSize;
        RayTracingProps.MaxShaderRecordStride    = vkRTPipelineProps.maxShaderGroupStride;
        RayTracingProps.ShaderGroupBaseAlignment = vkRTPipelineProps.shaderGroupBaseAlignment;
        RayTracingProps.MaxRayGenThreads         = vkRTPipelineProps.maxRayDispatchInvocationCount;
        RayTracingProps.MaxInstancesPerTLAS      = static_cast<Uint32>(vkASLimits.maxInstanceCount);
        RayTracingProps.MaxPrimitivesPerBLAS     = static_cast<Uint32>(vkASLimits.maxPrimitiveCount);
        RayTracingProps.MaxGeometriesPerBLAS     = static_cast<Uint32>(vkASLimits.maxGeometryCount);
        RayTracingProps.VertexBufferAlignment    = 1;
        RayTracingProps.IndexBufferAlignment     = 1;
        RayTracingProps.TransformBufferAlignment = 16; // from specs
        RayTracingProps.BoxBufferAlignment       = 8;  // from specs
        RayTracingProps.ScratchBufferAlignment   = static_cast<Uint32>(vkASLimits.minAccelerationStructureScratchOffsetAlignment);
        RayTracingProps.InstanceBufferAlignment  = 16; // from specs

        if (vkExtFeatures.RayTracingPipeline.rayTracingPipeline)
            RayTracingProps.CapFlags |= RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS;
        if (vkExtFeatures.RayQuery.rayQuery)
            RayTracingProps.CapFlags |= RAY_TRACING_CAP_FLAG_INLINE_RAY_TRACING;
        if (vkExtFeatures.RayTracingPipeline.rayTracingPipelineTraceRaysIndirect)
            RayTracingProps.CapFlags |= RAY_TRACING_CAP_FLAG_INDIRECT_RAY_TRACING;
        ASSERT_SIZEOF(RayTracingProps, 60, "Did you add a new member to RayTracingProperites? Please initialize it here.");
    }

    // Wave op properties
    if (AdapterInfo.Features.WaveOp)
    {
        const VkPhysicalDeviceSubgroupProperties& vkWaveProps  = vkDeviceExtProps.Subgroup;
        const VkShaderStageFlags                  WaveOpStages = vkWaveProps.supportedStages;

        VkShaderStageFlags SupportedStages = WaveOpStages & (VK_SHADER_STAGE_VERTEX_BIT | VK_SHADER_STAGE_FRAGMENT_BIT | VK_SHADER_STAGE_COMPUTE_BIT);
        if (vkFeatures.geometryShader != VK_FALSE)
            SupportedStages |= WaveOpStages & VK_SHADER_STAGE_GEOMETRY_BIT;
        if (vkFeatures.tessellationShader != VK_FALSE)
            SupportedStages |= WaveOpStages & (VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
        if (vkExtFeatures.MeshShader.meshShader != VK_FALSE && vkExtFeatures.MeshShader.taskShader != VK_FALSE)
            SupportedStages |= WaveOpStages & (VK_SHADER_STAGE_TASK_BIT_EXT | VK_SHADER_STAGE_MESH_BIT_EXT);
        if (vkExtFeatures.RayTracingPipeline.rayTracingPipeline != VK_FALSE)
        {
            constexpr VkShaderStageFlags VK_SHADER_STAGE_ALL_RAY_TRACING =
                VK_SHADER_STAGE_RAYGEN_BIT_KHR |
                VK_SHADER_STAGE_ANY_HIT_BIT_KHR |
                VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR |
                VK_SHADER_STAGE_MISS_BIT_KHR |
                VK_SHADER_STAGE_INTERSECTION_BIT_KHR |
                VK_SHADER_STAGE_CALLABLE_BIT_KHR;
            SupportedStages |= WaveOpStages & VK_SHADER_STAGE_ALL_RAY_TRACING;
        }

        WaveOpProperties& WaveOpProps{AdapterInfo.WaveOp};
        WaveOpProps.MinSize         = vkWaveProps.subgroupSize;
        WaveOpProps.MaxSize         = vkWaveProps.subgroupSize;
        WaveOpProps.SupportedStages = VkShaderStageFlagsToShaderTypes(SupportedStages);
        WaveOpProps.Features        = VkSubgroupFeatureFlagsToWaveFeatures(vkWaveProps.supportedOperations);
        ASSERT_SIZEOF(WaveOpProps, 16, "Did you add a new member to WaveOpProperties? Please initialize it here.");
    }

    // Mesh shader properties
    if (AdapterInfo.Features.MeshShaders)
    {
        MeshShaderProperties& MeshProps{AdapterInfo.MeshShader};
        MeshProps.MaxThreadGroupCountX     = vkDeviceExtProps.MeshShader.maxMeshWorkGroupCount[0];
        MeshProps.MaxThreadGroupCountY     = vkDeviceExtProps.MeshShader.maxMeshWorkGroupCount[1];
        MeshProps.MaxThreadGroupCountZ     = vkDeviceExtProps.MeshShader.maxMeshWorkGroupCount[2];
        MeshProps.MaxThreadGroupTotalCount = vkDeviceExtProps.MeshShader.maxMeshWorkGroupTotalCount;
        ASSERT_SIZEOF(MeshProps, 16, "Did you add a new member to MeshShaderProperties? Please initialize it here.");
    }

    // Compute shader properties
    {
        ComputeShaderProperties& CompProps{AdapterInfo.ComputeShader};
        CompProps.SharedMemorySize          = vkDeviceProps.limits.maxComputeSharedMemorySize;
        CompProps.MaxThreadGroupInvocations = vkDeviceProps.limits.maxComputeWorkGroupInvocations;
        CompProps.MaxThreadGroupSizeX       = vkDeviceProps.limits.maxComputeWorkGroupSize[0];
        CompProps.MaxThreadGroupSizeY       = vkDeviceProps.limits.maxComputeWorkGroupSize[1];
        CompProps.MaxThreadGroupSizeZ       = vkDeviceProps.limits.maxComputeWorkGroupSize[2];
        CompProps.MaxThreadGroupCountX      = vkDeviceProps.limits.maxComputeWorkGroupCount[0];
        CompProps.MaxThreadGroupCountY      = vkDeviceProps.limits.maxComputeWorkGroupCount[1];
        CompProps.MaxThreadGroupCountZ      = vkDeviceProps.limits.maxComputeWorkGroupCount[2];
        ASSERT_SIZEOF(CompProps, 32, "Did you add a new member to ComputeShaderProperties? Please initialize it here.");
    }

    // Shading rate properties
    if (AdapterInfo.Features.VariableRateShading)
    {
        ShadingRateProperties& ShadingRateProps{AdapterInfo.ShadingRate};

        // VK_KHR_fragment_shading_rate
        if (vkExtFeatures.ShadingRate.pipelineFragmentShadingRate != VK_FALSE ||
            vkExtFeatures.ShadingRate.primitiveFragmentShadingRate != VK_FALSE ||
            vkExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE)
        {
            auto SetShadingRateCap = [&ShadingRateProps](VkBool32 vkFlag, SHADING_RATE_CAP_FLAGS CapFlag) {
                if (vkFlag != VK_FALSE)
                    ShadingRateProps.CapFlags |= CapFlag;
            };

            // clang-format off
            SetShadingRateCap(vkExtFeatures.ShadingRate.pipelineFragmentShadingRate,                          SHADING_RATE_CAP_FLAG_PER_DRAW);
            SetShadingRateCap(vkExtFeatures.ShadingRate.primitiveFragmentShadingRate,                         SHADING_RATE_CAP_FLAG_PER_PRIMITIVE);
            SetShadingRateCap(vkExtFeatures.ShadingRate.attachmentFragmentShadingRate,                        SHADING_RATE_CAP_FLAG_TEXTURE_BASED);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.fragmentShadingRateWithSampleMask,                 SHADING_RATE_CAP_FLAG_SAMPLE_MASK);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.fragmentShadingRateWithShaderSampleMask,           SHADING_RATE_CAP_FLAG_SHADER_SAMPLE_MASK);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.fragmentShadingRateWithShaderDepthStencilWrites,   SHADING_RATE_CAP_FLAG_SHADER_DEPTH_STENCIL_WRITE);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.primitiveFragmentShadingRateWithMultipleViewports, SHADING_RATE_CAP_FLAG_PER_PRIMITIVE_WITH_MULTIPLE_VIEWPORTS);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.layeredShadingRateAttachments,                     SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY);
            // clang-format on

            if (ShadingRateProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_BASED)
                ShadingRateProps.CapFlags |= SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET;

            // Always enabled in Vulkan
            ShadingRateProps.CapFlags |= SHADING_RATE_CAP_FLAG_SHADING_RATE_SHADER_INPUT;

            ShadingRateProps.Combiners = SHADING_RATE_COMBINER_PASSTHROUGH | SHADING_RATE_COMBINER_OVERRIDE;

            if (vkDeviceExtProps.ShadingRate.fragmentShadingRateNonTrivialCombinerOps != VK_FALSE)
            {
                ShadingRateProps.Combiners |= SHADING_RATE_COMBINER_MIN | SHADING_RATE_COMBINER_MAX;
                ShadingRateProps.Combiners |= (vkDeviceExtProps.ShadingRate.fragmentShadingRateStrictMultiplyCombiner != VK_FALSE) ?
                    SHADING_RATE_COMBINER_MUL :
                    SHADING_RATE_COMBINER_SUM;
            }
            if (vkExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE)
            {
                ShadingRateProps.Format         = SHADING_RATE_FORMAT_PALETTE;
                ShadingRateProps.MinTileSize[0] = vkDeviceExtProps.ShadingRate.minFragmentShadingRateAttachmentTexelSize.width;
                ShadingRateProps.MinTileSize[1] = vkDeviceExtProps.ShadingRate.minFragmentShadingRateAttachmentTexelSize.height;
                ShadingRateProps.MaxTileSize[0] = vkDeviceExtProps.ShadingRate.maxFragmentShadingRateAttachmentTexelSize.width;
                ShadingRateProps.MaxTileSize[1] = vkDeviceExtProps.ShadingRate.maxFragmentShadingRateAttachmentTexelSize.height;
            }

            std::vector<VkPhysicalDeviceFragmentShadingRateKHR> ShadingRates;
#if DILIGENT_USE_VOLK
            {
                Uint32 ShadingRateCount = 0;
                vkGetPhysicalDeviceFragmentShadingRatesKHR(PhysicalDevice.GetVkDeviceHandle(), &ShadingRateCount, nullptr);
                VERIFY_EXPR(ShadingRateCount >= 3); // Spec says that implementation must support at least 3 predefined modes.

                ShadingRates.resize(ShadingRateCount);
                for (VkPhysicalDeviceFragmentShadingRateKHR& SR : ShadingRates)
                    SR.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_KHR;
                vkGetPhysicalDeviceFragmentShadingRatesKHR(PhysicalDevice.GetVkDeviceHandle(), &ShadingRateCount, ShadingRates.data());
            }
#else
            UNSUPPORTED("vkGetPhysicalDeviceFragmentShadingRatesKHR is only available through Volk");
#endif
            constexpr VkSampleCountFlags VK_SAMPLE_COUNT_ALL = (VK_SAMPLE_COUNT_64_BIT << 1) - 1;

            ShadingRateProps.NumShadingRates = StaticCast<Uint8>(std::min(ShadingRates.size(), size_t{MAX_SHADING_RATES}));
            for (Uint32 i = 0; i < ShadingRateProps.NumShadingRates; ++i)
            {
                const VkPhysicalDeviceFragmentShadingRateKHR& Src = ShadingRates[i];
                ShadingRateMode&                              Dst = ShadingRateProps.ShadingRates[i];

                // maxFragmentShadingRateRasterizationSamples - contains only maximum bit
                // sampleCounts - contains all supported bits
                VERIFY_EXPR((Src.fragmentSize.width == 1 && Src.fragmentSize.height == 1) ||
                            (Uint32{Src.sampleCounts} <= ((static_cast<Uint32>(vkDeviceExtProps.ShadingRate.maxFragmentShadingRateRasterizationSamples) << 1) - 1)));

                Dst.SampleBits = VkSampleCountFlagsToSampleCount(Src.sampleCounts & VK_SAMPLE_COUNT_ALL);
                Dst.Rate       = VkFragmentSizeToShadingRate(Src.fragmentSize);
            }
        }
        // VK_EXT_fragment_density_map
        else if (vkExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE)
        {
            ShadingRateProps.Format    = SHADING_RATE_FORMAT_UNORM8;
            ShadingRateProps.Combiners = SHADING_RATE_COMBINER_PASSTHROUGH | SHADING_RATE_COMBINER_OVERRIDE;
            ShadingRateProps.CapFlags =
                SHADING_RATE_CAP_FLAG_TEXTURE_BASED |
                SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS |
                SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET;

            if (vkExtFeatures.FragmentDensityMap.fragmentDensityMapDynamic != VK_FALSE)
                ShadingRateProps.ShadingRateTextureAccess = SHADING_RATE_TEXTURE_ACCESS_ON_GPU;
            else if (vkExtFeatures.FragmentDensityMap2.fragmentDensityMapDeferred != VK_FALSE)
                ShadingRateProps.ShadingRateTextureAccess = SHADING_RATE_TEXTURE_ACCESS_ON_SUBMIT;
            else
                ShadingRateProps.ShadingRateTextureAccess = SHADING_RATE_TEXTURE_ACCESS_ON_SET_RTV;

            if (vkDeviceExtProps.FragmentDensityMap.fragmentDensityInvocations != VK_FALSE)
                ShadingRateProps.CapFlags |= SHADING_RATE_CAP_FLAG_ADDITIONAL_INVOCATIONS;

            if (vkExtFeatures.FragmentDensityMap.fragmentDensityMapNonSubsampledImages != VK_FALSE)
                ShadingRateProps.CapFlags |= SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET;

            ShadingRateProps.MaxSabsampledArraySlices = vkDeviceExtProps.FragmentDensityMap2.maxSubsampledArrayLayers; // zero if VK_EXT_fragment_density_map2 is not supported

            ShadingRateProps.MinTileSize[0] = vkDeviceExtProps.FragmentDensityMap.minFragmentDensityTexelSize.width;
            ShadingRateProps.MinTileSize[1] = vkDeviceExtProps.FragmentDensityMap.minFragmentDensityTexelSize.height;
            ShadingRateProps.MaxTileSize[0] = vkDeviceExtProps.FragmentDensityMap.maxFragmentDensityTexelSize.width;
            ShadingRateProps.MaxTileSize[1] = vkDeviceExtProps.FragmentDensityMap.maxFragmentDensityTexelSize.height;

            ShadingRateProps.NumShadingRates            = 1;
            ShadingRateProps.ShadingRates[0].Rate       = SHADING_RATE_1X1;
            ShadingRateProps.ShadingRates[0].SampleBits = SAMPLE_COUNT_ALL;
        }

        // Get supported bind flags
        if (ShadingRateProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_BASED)
        {
            VkFormat          vkSRTexFormat = VK_FORMAT_UNDEFINED;
            VkImageUsageFlags vkSRTexUsage  = 0;
            if (ShadingRateProps.Format == SHADING_RATE_FORMAT_UNORM8)
            {
                vkSRTexFormat = VK_FORMAT_R8G8_UNORM;
                vkSRTexUsage  = VK_IMAGE_USAGE_FRAGMENT_DENSITY_MAP_BIT_EXT;
            }
            else
            {
                vkSRTexFormat = VK_FORMAT_R8_UINT;
                vkSRTexUsage  = VK_IMAGE_USAGE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR;
            }

            auto TestImageUsage = [&](VkImageUsageFlags Usage) {
                VkImageFormatProperties ImgFmtProps{};

                VkResult err = vkGetPhysicalDeviceImageFormatProperties(PhysicalDevice.GetVkDeviceHandle(), vkSRTexFormat, VK_IMAGE_TYPE_2D, VK_IMAGE_TILING_OPTIMAL,
                                                                        vkSRTexUsage | Usage, 0, &ImgFmtProps);
                return err == VK_SUCCESS;
            };

            VkFormatProperties vkFmtProps = {};
            vkGetPhysicalDeviceFormatProperties(PhysicalDevice.GetVkDeviceHandle(), vkSRTexFormat, &vkFmtProps);
            VERIFY_EXPR(vkFmtProps.optimalTilingFeatures & (VK_FORMAT_FEATURE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR | VK_FORMAT_FEATURE_FRAGMENT_DENSITY_MAP_BIT_EXT));

            ShadingRateProps.BindFlags = BIND_SHADING_RATE;
            if ((vkFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT) != 0 && TestImageUsage(VK_IMAGE_USAGE_SAMPLED_BIT))
                ShadingRateProps.BindFlags |= BIND_SHADER_RESOURCE;
            if ((vkFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT) != 0 && TestImageUsage(VK_IMAGE_USAGE_STORAGE_BIT))
                ShadingRateProps.BindFlags |= BIND_UNORDERED_ACCESS;
            if ((vkFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT) != 0 && TestImageUsage(VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT))
                ShadingRateProps.BindFlags |= BIND_RENDER_TARGET;
        }

        ASSERT_SIZEOF(ShadingRateProps, 52, "Did you add a new member to ShadingRateProperties? Please initialize it here.");
    }

    // Draw command properties
    {
        DrawCommandProperties& DrawCommandProps{AdapterInfo.DrawCommand};
        DrawCommandProps.MaxIndexValue        = vkDeviceProps.limits.maxDrawIndexedIndexValue;
        DrawCommandProps.MaxDrawIndirectCount = vkDeviceProps.limits.maxDrawIndirectCount;
        DrawCommandProps.CapFlags             = DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT | DRAW_COMMAND_CAP_FLAG_BASE_VERTEX;
        if (vkFeatures.multiDrawIndirect != VK_FALSE || vkExtFeatures.DrawIndirectCount)
            DrawCommandProps.CapFlags |= DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT;
        if (vkFeatures.drawIndirectFirstInstance != VK_FALSE)
            DrawCommandProps.CapFlags |= DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_FIRST_INSTANCE;
        if (vkExtFeatures.DrawIndirectCount)
            DrawCommandProps.CapFlags |= DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER;
        ASSERT_SIZEOF(DrawCommandProps, 12, "Did you add a new member to DrawCommandProperties? Please initialize it here.");
    }

    // Sparse memory properties
    if (AdapterInfo.Features.SparseResources)
    {
        // Same check as in VkFeaturesToDeviceFeatures()
        VERIFY_EXPR(vkFeatures.sparseBinding && (vkFeatures.sparseResidencyBuffer || vkFeatures.sparseResidencyImage2D));

        const VkPhysicalDeviceSparseProperties& SparseProps{vkDeviceProps.sparseProperties};
        SparseResourceProperties&               SparseRes{AdapterInfo.SparseResources};
        SparseRes.AddressSpaceSize  = vkDeviceLimits.sparseAddressSpaceSize;
        SparseRes.ResourceSpaceSize = vkDeviceLimits.sparseAddressSpaceSize; // no way to query
        SparseRes.StandardBlockSize = 64u << 10;                             // docs: "All currently defined standard sparse image block shapes are 64 KB in size."

        SparseRes.BufferBindFlags =
            BIND_VERTEX_BUFFER |
            BIND_INDEX_BUFFER |
            BIND_UNIFORM_BUFFER |
            BIND_SHADER_RESOURCE |
            BIND_UNORDERED_ACCESS |
            BIND_INDIRECT_DRAW_ARGS |
            BIND_RAY_TRACING;

        SparseRes.CapFlags |=
            SPARSE_RESOURCE_CAP_FLAG_NON_RESIDENT_SAFE |
            SPARSE_RESOURCE_CAP_FLAG_MIXED_RESOURCE_TYPE_SUPPORT;

        auto SetSparseResCap = [&SparseRes](VkBool32 Feature, SPARSE_RESOURCE_CAP_FLAGS Flag) {
            if (Feature != VK_FALSE)
                SparseRes.CapFlags |= Flag;
        };
        // clang-format off
        SetSparseResCap(SparseProps.residencyStandard2DBlockShape,            SPARSE_RESOURCE_CAP_FLAG_STANDARD_2D_TILE_SHAPE   );
        SetSparseResCap(SparseProps.residencyStandard2DMultisampleBlockShape, SPARSE_RESOURCE_CAP_FLAG_STANDARD_2DMS_TILE_SHAPE );
        SetSparseResCap(SparseProps.residencyStandard3DBlockShape,            SPARSE_RESOURCE_CAP_FLAG_STANDARD_3D_TILE_SHAPE   );
        SetSparseResCap(SparseProps.residencyAlignedMipSize,                  SPARSE_RESOURCE_CAP_FLAG_ALIGNED_MIP_SIZE         );
        SetSparseResCap(SparseProps.residencyNonResidentStrict,               SPARSE_RESOURCE_CAP_FLAG_NON_RESIDENT_STRICT      );
        SetSparseResCap(vkFeatures.shaderResourceResidency,                   SPARSE_RESOURCE_CAP_FLAG_SHADER_RESOURCE_RESIDENCY);
        SetSparseResCap(vkFeatures.sparseResidencyBuffer,                     SPARSE_RESOURCE_CAP_FLAG_BUFFER                   );
        SetSparseResCap(vkFeatures.sparseResidencyImage2D,                    SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL);
        SetSparseResCap(vkFeatures.sparseResidencyImage3D,                    SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D               );
        SetSparseResCap(vkFeatures.sparseResidency2Samples,                   SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES        );
        SetSparseResCap(vkFeatures.sparseResidency4Samples,                   SPARSE_RESOURCE_CAP_FLAG_TEXTURE_4_SAMPLES        );
        SetSparseResCap(vkFeatures.sparseResidency8Samples,                   SPARSE_RESOURCE_CAP_FLAG_TEXTURE_8_SAMPLES        );
        SetSparseResCap(vkFeatures.sparseResidency16Samples,                  SPARSE_RESOURCE_CAP_FLAG_TEXTURE_16_SAMPLES       );
        SetSparseResCap(vkFeatures.sparseResidencyAliased,                    SPARSE_RESOURCE_CAP_FLAG_ALIASED                  );
        // clang-format on

        ASSERT_SIZEOF(SparseRes, 32, "Did you add a new member to SparseResourceProperties? Please initialize it here.");
    }

    // Set memory properties
    {
        AdapterMemoryInfo& Mem{AdapterInfo.Memory};
        Mem.LocalMemory         = 0;
        Mem.HostVisibleMemory   = 0;
        Mem.UnifiedMemory       = 0;
        Mem.MaxMemoryAllocation = vkDeviceExtProps.Maintenance3.maxMemoryAllocationSize;

        std::bitset<VK_MAX_MEMORY_HEAPS> DeviceLocalHeap;
        std::bitset<VK_MAX_MEMORY_HEAPS> HostVisibleHeap;
        std::bitset<VK_MAX_MEMORY_HEAPS> UnifiedHeap;

        const VkPhysicalDeviceMemoryProperties& MemoryProps = PhysicalDevice.GetMemoryProperties();
        for (uint32_t type = 0; type < MemoryProps.memoryTypeCount; ++type)
        {
            const VkMemoryType&             MemTypeInfo        = MemoryProps.memoryTypes[type];
            constexpr VkMemoryPropertyFlags UnifiedMemoryFlags = VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT | VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT;

            if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT)
            {
                Mem.MemorylessTextureBindFlags = BIND_RENDER_TARGET | BIND_DEPTH_STENCIL | BIND_INPUT_ATTACHMENT;
            }
            else if ((MemTypeInfo.propertyFlags & UnifiedMemoryFlags) == UnifiedMemoryFlags)
            {
                UnifiedHeap[MemTypeInfo.heapIndex] = true;
                if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT)
                    Mem.UnifiedMemoryCPUAccess |= CPU_ACCESS_WRITE;
                if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_HOST_CACHED_BIT)
                    Mem.UnifiedMemoryCPUAccess |= CPU_ACCESS_READ;
            }
            else if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT)
            {
                DeviceLocalHeap[MemTypeInfo.heapIndex] = true;
            }
            else if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT)
            {
                HostVisibleHeap[MemTypeInfo.heapIndex] = true;
            }

            // In Metal, input attachment with memoryless texture must be used as an imageblock,
            // which is not supported in SPIRV to MSL translator.
#if PLATFORM_MACOS || PLATFORM_IOS || PLATFORM_TVOS
            if (Mem.MemorylessTextureBindFlags != 0)
                Mem.MemorylessTextureBindFlags = BIND_RENDER_TARGET | BIND_DEPTH_STENCIL;
#endif
        }

        for (uint32_t heap = 0; heap < MemoryProps.memoryHeapCount; ++heap)
        {
            const VkMemoryHeap& HeapInfo = MemoryProps.memoryHeaps[heap];

            if (UnifiedHeap[heap])
                Mem.UnifiedMemory += static_cast<Uint64>(HeapInfo.size);
            else if (DeviceLocalHeap[heap])
                Mem.LocalMemory += static_cast<Uint64>(HeapInfo.size);
            else if (HostVisibleHeap[heap])
                Mem.HostVisibleMemory += static_cast<Uint64>(HeapInfo.size);
        }

        ASSERT_SIZEOF(Mem, 40, "Did you add a new member to AdapterMemoryInfo? Please initialize it here.");
    }

    // Set queue info
    {
        const auto& QueueProperties = PhysicalDevice.GetQueueProperties();
        AdapterInfo.NumQueues       = std::min(MAX_ADAPTER_QUEUES, static_cast<Uint32>(QueueProperties.size()));

        for (Uint32 q = 0; q < AdapterInfo.NumQueues; ++q)
        {
            const VkQueueFamilyProperties& SrcQueue = QueueProperties[q];
            CommandQueueInfo&              DstQueue = AdapterInfo.Queues[q];

            DstQueue.QueueType                 = VkQueueFlagsToCmdQueueType(SrcQueue.queueFlags);
            DstQueue.MaxDeviceContexts         = SrcQueue.queueCount;
            DstQueue.TextureCopyGranularity[0] = SrcQueue.minImageTransferGranularity.width;
            DstQueue.TextureCopyGranularity[1] = SrcQueue.minImageTransferGranularity.height;
            DstQueue.TextureCopyGranularity[2] = SrcQueue.minImageTransferGranularity.depth;
        }
    }

    return AdapterInfo;
}